

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_next_symbol(archive_read *a,huffman_code *code)

{
  uint uVar1;
  void *pvVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  rar_br *br_00;
  rar_br *br;
  rar *rar;
  int node;
  int value;
  int length;
  uint bits;
  uchar bit;
  huffman_code *code_local;
  archive_read *a_local;
  
  if ((code->table == (huffman_table_entry *)0x0) && (iVar4 = make_table(a,code), iVar4 != 0)) {
    a_local._4_4_ = -1;
  }
  else {
    pvVar2 = a->format->data;
    br_00 = (rar_br *)((long)pvVar2 + 0x4f30);
    if ((*(int *)((long)pvVar2 + 0x4f38) < code->tablesize) &&
       ((iVar4 = rar_br_fillup(a,br_00), iVar4 == 0 &&
        (*(int *)((long)pvVar2 + 0x4f38) < code->tablesize)))) {
      archive_set_error(&a->archive,0x54,"Truncated RAR file data");
      *(undefined1 *)((long)pvVar2 + 0xd0) = 0;
      a_local._4_4_ = -1;
    }
    else {
      uVar5 = (uint)(br_00->cache_buffer >>
                    ((char)*(undefined4 *)((long)pvVar2 + 0x4f38) - (char)code->tablesize & 0x3fU))
              & cache_masks[code->tablesize];
      uVar1 = code->table[uVar5].length;
      rar._4_4_ = code->table[uVar5].value;
      if ((int)uVar1 < 0) {
        archive_set_error(&a->archive,0x54,"Invalid prefix code in bitstream");
        a_local._4_4_ = -1;
      }
      else if (code->tablesize < (int)uVar1) {
        *(int *)((long)pvVar2 + 0x4f38) = *(int *)((long)pvVar2 + 0x4f38) - code->tablesize;
        while (code->tree[rar._4_4_].branches[0] != code->tree[rar._4_4_].branches[1]) {
          if (((*(int *)((long)pvVar2 + 0x4f38) < 1) && (iVar4 = rar_br_fillup(a,br_00), iVar4 == 0)
              ) && (*(int *)((long)pvVar2 + 0x4f38) < 1)) {
            archive_set_error(&a->archive,0x54,"Truncated RAR file data");
            *(undefined1 *)((long)pvVar2 + 0xd0) = 0;
            return -1;
          }
          bVar3 = (byte)(br_00->cache_buffer >>
                        ((char)*(undefined4 *)((long)pvVar2 + 0x4f38) - 1U & 0x3f)) & 1;
          *(int *)((long)pvVar2 + 0x4f38) = *(int *)((long)pvVar2 + 0x4f38) + -1;
          if (code->tree[rar._4_4_].branches[bVar3] < 0) {
            archive_set_error(&a->archive,0x54,"Invalid prefix code in bitstream");
            return -1;
          }
          rar._4_4_ = code->tree[rar._4_4_].branches[bVar3];
        }
        a_local._4_4_ = code->tree[rar._4_4_].branches[0];
      }
      else {
        *(uint *)((long)pvVar2 + 0x4f38) = *(int *)((long)pvVar2 + 0x4f38) - uVar1;
        a_local._4_4_ = rar._4_4_;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_next_symbol(struct archive_read *a, struct huffman_code *code)
{
  unsigned char bit;
  unsigned int bits;
  int length, value, node;
  struct rar *rar;
  struct rar_br *br;

  if (!code->table)
  {
    if (make_table(a, code) != (ARCHIVE_OK))
      return -1;
  }

  rar = (struct rar *)(a->format->data);
  br = &(rar->br);

  /* Look ahead (peek) at bits */
  if (!rar_br_read_ahead(a, br, code->tablesize)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return -1;
  }
  bits = rar_br_bits(br, code->tablesize);

  length = code->table[bits].length;
  value = code->table[bits].value;

  if (length < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid prefix code in bitstream");
    return -1;
  }

  if (length <= code->tablesize)
  {
    /* Skip length bits */
    rar_br_consume(br, length);
    return value;
  }

  /* Skip tablesize bits */
  rar_br_consume(br, code->tablesize);

  node = value;
  while (code->tree[node].branches[0] != code->tree[node].branches[1])
  {
    if (!rar_br_read_ahead(a, br, 1)) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Truncated RAR file data");
      rar->valid = 0;
      return -1;
    }
    bit = rar_br_bits(br, 1);
    rar_br_consume(br, 1);

    if (code->tree[node].branches[bit] < 0)
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Invalid prefix code in bitstream");
      return -1;
    }
    node = code->tree[node].branches[bit];
  }

  return code->tree[node].branches[0];
}